

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O0

void libtest::unit_test<libtest::a_plus_b>::gen
               (usize small_gen_num,usize large_gen_num,bool testcase_cache)

{
  bool bVar1;
  int iVar2;
  undefined1 in_CL;
  path local_1c8;
  ansi_sgr local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  path input_file_path_1;
  usize index_1;
  ansi_sgr local_138;
  undefined8 local_130;
  path local_128;
  ansi_sgr local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined1 local_e8 [8];
  path output_file_path;
  path input_file_path;
  usize index;
  path local_68;
  ansi_sgr local_2c;
  ansi_sgr local_24;
  byte local_19;
  usize uStack_18;
  bool testcase_cache_local;
  usize large_gen_num_local;
  usize small_gen_num_local;
  
  local_24.m_color = cyan;
  local_24.m_attr = reset;
  local_19 = testcase_cache;
  uStack_18 = large_gen_num;
  large_gen_num_local = small_gen_num;
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[----------] ");
  local_2c.m_color = white;
  local_2c.m_attr = bold;
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000025,"Generate tests\n");
  if ((gen(unsigned_long,unsigned_long,bool)::input_file == '\0') &&
     (iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::input_file), iVar2 != 0))
  {
    std::ofstream::ofstream(gen(unsigned_long,unsigned_long,bool)::input_file);
    __cxa_atexit(std::ofstream::~ofstream,gen(unsigned_long,unsigned_long,bool)::input_file,
                 &__dso_handle);
    __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::input_file);
  }
  if ((gen(unsigned_long,unsigned_long,bool)::output_file == '\0') &&
     (iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::output_file), iVar2 != 0))
  {
    std::ifstream::ifstream(gen(unsigned_long,unsigned_long,bool)::output_file);
    __cxa_atexit(std::ifstream::~ifstream,gen(unsigned_long,unsigned_long,bool)::output_file,
                 &__dso_handle);
    __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::output_file);
  }
  test_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&local_68);
  gen_case_dir_abi_cxx11_();
  std::filesystem::create_directory((path *)&index);
  std::filesystem::__cxx11::path::~path((path *)&index);
  std::filesystem::__cxx11::path::~path(&local_68);
  input_file_path._M_cmpts = (_List)0x1;
  input_file_path._33_7_ = 0;
  for (; (ulong)input_file_path._32_8_ <= large_gen_num_local;
      input_file_path._32_8_ = input_file_path._32_8_ + 1) {
    small_genfile_path_abi_cxx11_
              ((path *)&output_file_path._M_cmpts,
               (unit_test<libtest::a_plus_b> *)input_file_path._32_8_,1,(bool)in_CL);
    small_genfile_path_abi_cxx11_
              ((path *)local_e8,(unit_test<libtest::a_plus_b> *)input_file_path._32_8_,0,(bool)in_CL
              );
    if (((local_19 & 1) == 0) ||
       (bVar1 = std::filesystem::exists((path *)&output_file_path._M_cmpts), !bVar1)) {
      local_f8 = 0x20;
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      local_100.m_color = white;
      local_100.m_attr = reset;
      std::filesystem::__cxx11::path::filename(&local_128,(path *)&output_file_path._M_cmpts);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>(local_100,&local_128);
      std::filesystem::__cxx11::path::~path(&local_128);
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ofstream<char,_std::char_traits<char>_> *)
                 gen(unsigned_long,unsigned_long,bool)::input_file,
                 (path *)&output_file_path._M_cmpts,_S_out);
      a_plus_b::generate_input<libtest::a_plus_b::small_constraints>
                ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
      std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 gen(unsigned_long,unsigned_long,bool)::output_file,
                 (path *)&output_file_path._M_cmpts,_S_in);
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ofstream<char,_std::char_traits<char>_> *)
                 gen(unsigned_long,unsigned_long,bool)::input_file,(path *)local_e8,_S_out);
      local_130 = 0x20;
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      local_138.m_color = white;
      local_138.m_attr = reset;
      std::filesystem::__cxx11::path::filename((path *)&index_1,(path *)local_e8);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>(local_138,(path *)&index_1);
      std::filesystem::__cxx11::path::~path((path *)&index_1);
      a_plus_b::generate_output
                ((ifstream *)gen(unsigned_long,unsigned_long,bool)::output_file,
                 (ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
      std::ifstream::close();
      local_ec = 0;
    }
    else {
      local_ec = 4;
    }
    std::filesystem::__cxx11::path::~path((path *)local_e8);
    std::filesystem::__cxx11::path::~path((path *)&output_file_path._M_cmpts);
  }
  input_file_path_1._M_cmpts = (_List)0x1;
  input_file_path_1._33_7_ = 0;
  for (; (ulong)input_file_path_1._32_8_ <= uStack_18;
      input_file_path_1._32_8_ = input_file_path_1._32_8_ + 1) {
    large_genfile_path_abi_cxx11_
              ((path *)local_190,(unit_test<libtest::a_plus_b> *)input_file_path_1._32_8_,1,
               (bool)in_CL);
    if (((local_19 & 1) == 0) || (bVar1 = std::filesystem::exists((path *)local_190), !bVar1)) {
      local_198 = 0x20;
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      local_1a0.m_color = white;
      local_1a0.m_attr = reset;
      std::filesystem::__cxx11::path::filename(&local_1c8,(path *)local_190);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>(local_1a0,&local_1c8);
      std::filesystem::__cxx11::path::~path(&local_1c8);
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ofstream<char,_std::char_traits<char>_> *)
                 gen(unsigned_long,unsigned_long,bool)::input_file,(path *)local_190,_S_out);
      a_plus_b::generate_input<libtest::a_plus_b::large_constraints>
                ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
      local_ec = 0;
    }
    else {
      local_ec = 7;
    }
    std::filesystem::__cxx11::path::~path((path *)local_190);
  }
  return;
}

Assistant:

static void gen(const usize small_gen_num, const usize large_gen_num, const bool testcase_cache)
    {
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Generate tests\n");
        static std::ofstream input_file;
        static std::ifstream output_file;
        fs::create_directory(test_case_dir()), fs::create_directory(gen_case_dir());
        for (usize index = 1; index <= small_gen_num; index++) {
            const fs::path input_file_path = small_genfile_path(index, true), output_file_path = small_genfile_path(index, false);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::small_constraints>(input_file);
            input_file.close(), output_file.open(input_file_path), input_file.open(output_file_path);
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, output_file_path.filename());
            Problem::generate_output(output_file, input_file);
            input_file.close(), output_file.close();
        }
        for (usize index = 1; index <= large_gen_num; index++) {
            const fs::path input_file_path = large_genfile_path(index, true);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::large_constraints>(input_file);
            input_file.close();
        }
    }